

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata *data)

{
  Funcdata *pFVar1;
  int iVar2;
  spacetype sVar3;
  int4 iVar4;
  ParamTrial *this;
  Varnode *pVVar5;
  PcodeOp *pPVar6;
  Varnode *loadval_1;
  int4 slot;
  PcodeOp *op_1;
  Varnode *local_a0;
  Varnode *loadval;
  undefined1 local_90 [4];
  int4 sz;
  uintb local_80;
  uintb off;
  AddrSpace *local_68;
  AddrSpace *spc;
  ProtoParameter *local_50;
  ProtoParameter *param;
  byte local_3d;
  int4 i;
  bool setplaceholder;
  PcodeOp *pPStack_38;
  int4 numparam;
  PcodeOp *op;
  ParamActive *active;
  AddrSpace *spacebase;
  bool varargs;
  Funcdata *pFStack_18;
  bool inputlocked;
  Funcdata *data_local;
  FuncCallSpecs *fc_local;
  
  pFStack_18 = data;
  data_local = (Funcdata *)fc;
  spacebase._7_1_ = FuncProto::isInputLocked(&fc->super_FuncProto);
  spacebase._6_1_ = FuncProto::isDotdotdot((FuncProto *)data_local);
  active = (ParamActive *)FuncProto::getSpacebase((FuncProto *)data_local);
  op = (PcodeOp *)FuncCallSpecs::getActiveInput((FuncCallSpecs *)data_local);
  if (((spacebase._7_1_ & 1) == 0) || ((spacebase._6_1_ & 1) != 0)) {
    FuncCallSpecs::initActiveInput((FuncCallSpecs *)data_local);
  }
  if ((spacebase._7_1_ & 1) != 0) {
    pPStack_38 = FuncCallSpecs::getOp((FuncCallSpecs *)data_local);
    i = FuncProto::numParams((FuncProto *)data_local);
    local_3d = spacebase._6_1_ & 1;
    for (param._4_4_ = 0; param._4_4_ < i; param._4_4_ = param._4_4_ + 1) {
      local_50 = FuncProto::getParam((FuncProto *)data_local,param._4_4_);
      pPVar6 = op;
      (*local_50->_vptr_ProtoParameter[4])(&spc);
      iVar2 = (*local_50->_vptr_ProtoParameter[5])();
      ParamActive::registerTrial((ParamActive *)pPVar6,(Address *)&spc,iVar2);
      this = ParamActive::getTrial((ParamActive *)op,param._4_4_);
      ParamTrial::markActive(this);
      (*local_50->_vptr_ProtoParameter[4])(&off);
      local_68 = Address::getSpace((Address *)&off);
      (*local_50->_vptr_ProtoParameter[4])(local_90);
      local_80 = Address::getOffset((Address *)local_90);
      loadval._4_4_ = (*local_50->_vptr_ProtoParameter[5])();
      sVar3 = AddrSpace::getType(local_68);
      pFVar1 = pFStack_18;
      pPVar6 = pPStack_38;
      if (sVar3 == IPTR_SPACEBASE) {
        pVVar5 = Funcdata::opStackLoad
                           (pFStack_18,local_68,local_80,loadval._4_4_,pPStack_38,(Varnode *)0x0,
                            false);
        pFVar1 = pFStack_18;
        pPVar6 = pPStack_38;
        local_a0 = pVVar5;
        iVar4 = PcodeOp::numInput(pPStack_38);
        Funcdata::opInsertInput(pFVar1,pPVar6,pVVar5,iVar4);
        if ((local_3d & 1) == 0) {
          local_3d = 1;
          Varnode::setSpacebasePlaceholder(local_a0);
          active = (ParamActive *)0x0;
        }
      }
      else {
        iVar2 = (*local_50->_vptr_ProtoParameter[5])();
        (*local_50->_vptr_ProtoParameter[4])(&op_1);
        pVVar5 = Funcdata::newVarnode(pFVar1,iVar2,(Address *)&op_1,(Datatype *)0x0);
        iVar4 = PcodeOp::numInput(pPStack_38);
        Funcdata::opInsertInput(pFVar1,pPVar6,pVVar5,iVar4);
      }
    }
  }
  if (active != (ParamActive *)0x0) {
    pPVar6 = FuncCallSpecs::getOp((FuncCallSpecs *)data_local);
    iVar4 = PcodeOp::numInput(pPVar6);
    pVVar5 = Funcdata::opStackLoad(pFStack_18,(AddrSpace *)active,0,1,pPVar6,(Varnode *)0x0,false);
    Funcdata::opInsertInput(pFStack_18,pPVar6,pVVar5,iVar4);
    FuncCallSpecs::setStackPlaceholderSlot((FuncCallSpecs *)data_local,iVar4);
    Varnode::setSpacebasePlaceholder(pVVar5);
  }
  return;
}

Assistant:

void ActionFuncLink::funcLinkInput(FuncCallSpecs *fc,Funcdata &data)

{
  bool inputlocked = fc->isInputLocked();
  bool varargs = fc->isDotdotdot();
  AddrSpace *spacebase = fc->getSpacebase();	// Non-zero spacebase indicates we need a stackplaceholder
  ParamActive *active = fc->getActiveInput();

  if ((!inputlocked)||varargs)
    fc->initActiveInput();
  if (inputlocked) {
    PcodeOp *op = fc->getOp();
    int4 numparam = fc->numParams();
    bool setplaceholder = varargs;
    for(int4 i=0;i<numparam;++i) {
      ProtoParameter *param = fc->getParam(i);
      active->registerTrial(param->getAddress(),param->getSize());
      active->getTrial(i).markActive(); // Parameter is not optional
      AddrSpace *spc = param->getAddress().getSpace();
      uintb off = param->getAddress().getOffset();
      int4 sz = param->getSize();
      if (spc->getType() == IPTR_SPACEBASE) { // Param is stack relative
	Varnode *loadval = data.opStackLoad(spc,off,sz,op,(Varnode *)0,false);
	data.opInsertInput(op,loadval,op->numInput());
	if (!setplaceholder) {
	  setplaceholder = true;
	  loadval->setSpacebasePlaceholder();
	  spacebase = (AddrSpace *)0;	// With a locked stack parameter, we don't need a stackplaceholder
	}
      }
      else
	data.opInsertInput(op,data.newVarnode(param->getSize(),param->getAddress()),op->numInput());
    }
  }
  if (spacebase != (AddrSpace *)0) {	// If we need it, create the stackplaceholder
    PcodeOp *op = fc->getOp();
    int4 slot = op->numInput();
    Varnode *loadval = data.opStackLoad(spacebase,0,1,op,(Varnode *)0,false);
    data.opInsertInput(op,loadval,slot);
    fc->setStackPlaceholderSlot(slot);
    loadval->setSpacebasePlaceholder();
  }
}